

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

RequiredError *
CLI::RequiredError::Option
          (RequiredError *__return_storage_ptr__,size_t min_option,size_t max_option,size_t used,
          string *option_list)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  uVar1 = min_option ^ 1;
  if (((max_option ^ 1) == 0 && uVar1 == 0) && used == 0) {
    ::std::operator+(&local_1c0,"Exactly 1 option from [",option_list);
    ::std::operator+(&local_40,&local_1c0,"]");
    RequiredError(__return_storage_ptr__,&local_40);
    pbVar2 = &local_40;
  }
  else {
    if (((max_option ^ 1) == 0 && uVar1 == 0) && 1 < used) {
      ::std::operator+(&local_160,"Exactly 1 option from [",option_list);
      ::std::operator+(&local_180,&local_160,"] is required and ");
      std::__cxx11::to_string(&local_1a0,used);
      ::std::operator+(&local_1c0,&local_180,&local_1a0);
      ::std::operator+(&local_60,&local_1c0," were given");
      RequiredError(__return_storage_ptr__,&local_60,RequiredError);
      ::std::__cxx11::string::~string((string *)&local_60);
      ::std::__cxx11::string::~string((string *)&local_1c0);
      ::std::__cxx11::string::~string((string *)&local_1a0);
      ::std::__cxx11::string::~string((string *)&local_180);
      pbVar2 = &local_160;
      goto LAB_0011ff12;
    }
    if (uVar1 != 0 || used != 0) {
      if (used < min_option) {
        std::__cxx11::to_string(&local_100,min_option);
        ::std::operator+(&local_120,"Requires at least ",&local_100);
        ::std::operator+(&local_1a0,&local_120," options used and only ");
        std::__cxx11::to_string(&local_140,used);
        ::std::operator+(&local_160,&local_1a0,&local_140);
        ::std::operator+(&local_180,&local_160,"were given from [");
        ::std::operator+(&local_1c0,&local_180,option_list);
        ::std::operator+(&local_a0,&local_1c0,"]");
        RequiredError(__return_storage_ptr__,&local_a0,RequiredError);
        pbVar2 = &local_a0;
      }
      else {
        if (max_option == 1) {
          ::std::operator+(&local_1c0,"Requires at most 1 options be given from [",option_list);
          ::std::operator+(&local_c0,&local_1c0,"]");
          RequiredError(__return_storage_ptr__,&local_c0,RequiredError);
          pbVar2 = &local_c0;
          goto LAB_0011fbb8;
        }
        std::__cxx11::to_string(&local_100,max_option);
        ::std::operator+(&local_120,"Requires at most ",&local_100);
        ::std::operator+(&local_1a0,&local_120," options be used and ");
        std::__cxx11::to_string(&local_140,used);
        ::std::operator+(&local_160,&local_1a0,&local_140);
        ::std::operator+(&local_180,&local_160,"were given from [");
        ::std::operator+(&local_1c0,&local_180,option_list);
        ::std::operator+(&local_e0,&local_1c0,"]");
        RequiredError(__return_storage_ptr__,&local_e0,RequiredError);
        pbVar2 = &local_e0;
      }
      ::std::__cxx11::string::~string((string *)pbVar2);
      ::std::__cxx11::string::~string((string *)&local_1c0);
      ::std::__cxx11::string::~string((string *)&local_180);
      ::std::__cxx11::string::~string((string *)&local_160);
      ::std::__cxx11::string::~string((string *)&local_140);
      ::std::__cxx11::string::~string((string *)&local_1a0);
      ::std::__cxx11::string::~string((string *)&local_120);
      pbVar2 = &local_100;
      goto LAB_0011ff12;
    }
    ::std::operator+(&local_1c0,"At least 1 option from [",option_list);
    ::std::operator+(&local_80,&local_1c0,"]");
    RequiredError(__return_storage_ptr__,&local_80);
    pbVar2 = &local_80;
  }
LAB_0011fbb8:
  ::std::__cxx11::string::~string((string *)pbVar2);
  pbVar2 = &local_1c0;
LAB_0011ff12:
  ::std::__cxx11::string::~string((string *)pbVar2);
  return __return_storage_ptr__;
}

Assistant:

static RequiredError
    Option(std::size_t min_option, std::size_t max_option, std::size_t used, const std::string &option_list) {
        if((min_option == 1) && (max_option == 1) && (used == 0))
            return RequiredError("Exactly 1 option from [" + option_list + "]");
        if((min_option == 1) && (max_option == 1) && (used > 1)) {
            return RequiredError("Exactly 1 option from [" + option_list + "] is required and " + std::to_string(used) +
                                     " were given",
                                 ExitCodes::RequiredError);
        }
        if((min_option == 1) && (used == 0))
            return RequiredError("At least 1 option from [" + option_list + "]");
        if(used < min_option) {
            return RequiredError("Requires at least " + std::to_string(min_option) + " options used and only " +
                                     std::to_string(used) + "were given from [" + option_list + "]",
                                 ExitCodes::RequiredError);
        }
        if(max_option == 1)
            return RequiredError("Requires at most 1 options be given from [" + option_list + "]",
                                 ExitCodes::RequiredError);

        return RequiredError("Requires at most " + std::to_string(max_option) + " options be used and " +
                                 std::to_string(used) + "were given from [" + option_list + "]",
                             ExitCodes::RequiredError);
    }